

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O1

string * __thiscall
MADPComponentDiscreteStates::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MADPComponentDiscreteStates *this)

{
  char cVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  stringstream ss2;
  stringstream ss;
  undefined1 local_330 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [23];
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (this->_m_initialized != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"- nr. states=",0xd);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    SoftPrintStates_abi_cxx11_((string *)local_330,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,(char *)local_330._0_8_,local_330._8_8_);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_320[0]._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Initial state distr.: ",0x16);
    SoftPrintInitialStateDistribution_abi_cxx11_((string *)local_330,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,(char *)local_330._0_8_,local_330._8_8_);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_320[0]._M_allocated_capacity + 1);
    }
    cVar1 = (char)(ostream *)local_198;
    std::ios::widen((char)*(undefined8 *)(local_198[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_330);
  poVar2 = (ostream *)(local_330 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"MADPComponentDiscreteStates::SoftPrint(",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") - Error: not initialized. ",0x1c);
  std::endl<char,std::char_traits<char>>(poVar2);
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar3 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar3,&E::typeinfo,E::~E);
}

Assistant:

string MADPComponentDiscreteStates::SoftPrint() const
{
    stringstream ss;
    if(!_m_initialized)
    {
        stringstream ss2;
        ss2 << "MADPComponentDiscreteStates::SoftPrint("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss2);
    }
    ss << "- nr. states="<< GetNrStates()<<endl;
    ss << SoftPrintStates();
    ss << "Initial state distr.: ";
    ss << SoftPrintInitialStateDistribution();
    ss << endl;
    return(ss.str());
}